

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadHalfArray
          (CrateReader *this,bool is_compressed,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *d)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  uint64_t uVar3;
  ulong uVar4;
  bool bVar5;
  half hVar6;
  ostream *poVar7;
  ulong uVar8;
  pointer phVar9;
  long lVar10;
  size_t i;
  pointer phVar11;
  int iVar12;
  char *pcVar13;
  _Alloc_hider _Var14;
  size_t nbytes;
  size_t sVar15;
  size_t sz;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint32_t n;
  size_t length;
  uint32_t shapesize;
  ostringstream ss_e;
  string local_1f8;
  uint local_1d4;
  pointer local_1d0;
  string local_1c8;
  vector<int,_std::allocator<int>_> local_1a8 [4];
  ios_base local_138 [264];
  
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar5 = StreamReader::read4(this->_sr,(uint32_t *)&local_1c8);
    if (bVar5) {
      bVar5 = StreamReader::read4(this->_sr,&local_1d4);
      if (bVar5) {
        phVar9 = (pointer)(ulong)local_1d4;
        goto LAB_001b824f;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadHalfArray",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      iVar12 = 0x1ac;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadHalfArray",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      iVar12 = 0x1a7;
    }
    poVar7 = (ostream *)::std::ostream::operator<<(local_1a8,iVar12);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar13 = "Failed to read the number of array elements.";
    lVar10 = 0x2c;
LAB_001b85f0:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,lVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_001b864c;
  }
  else {
    bVar5 = StreamReader::read8(this->_sr,(uint64_t *)local_1a8);
    phVar9 = (pointer)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    if (!bVar5) goto LAB_001b83da;
LAB_001b824f:
    local_1d0 = phVar9;
    if (phVar9 <= (pointer)(this->_config).maxArrayElements) {
      uVar4 = (long)phVar9 * 2;
      uVar8 = this->_memoryUsage + uVar4;
      this->_memoryUsage = uVar8;
      if (uVar8 <= (this->_config).maxMemoryBudget) {
        ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                  (d,(size_type)phVar9);
        if (is_compressed) {
          pSVar2 = this->_sr;
          uVar8 = pSVar2->length_;
          uVar3 = pSVar2->idx_;
          if ((pointer)0xf < phVar9) {
            if (uVar3 + 1 <= uVar8) {
              uVar1 = pSVar2->binary_[uVar3];
              pSVar2->idx_ = uVar3 + 1;
              if (uVar1 == 't') {
                bVar5 = StreamReader::read4(pSVar2,(uint32_t *)&local_1c8);
                if (bVar5) {
                  local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (int *)0x0;
                  local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                  resize((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         local_1a8,(ulong)local_1c8._M_dataplus._M_p & 0xffffffff);
                  pSVar2 = this->_sr;
                  uVar3 = pSVar2->idx_;
                  uVar4 = ((ulong)local_1c8._M_dataplus._M_p & 0xffffffff) * 2;
                  sVar15 = pSVar2->length_ - uVar3;
                  if (uVar3 + ((ulong)local_1c8._M_dataplus._M_p & 0xffffffff) * 2 <=
                      pSVar2->length_) {
                    sVar15 = uVar4;
                  }
                  if (uVar4 <= sVar15 - 1) {
                    ::std::__cxx11::string::append((char *)&this->_err);
                    if (local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == (int *)0x0) {
                      return false;
                    }
                    operator_delete(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                    return false;
                  }
                  memcpy(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,sVar15);
                  pSVar2->idx_ = pSVar2->idx_ + sVar15;
                  local_1f8._M_dataplus._M_p = (pointer)0x0;
                  local_1f8._M_string_length = 0;
                  local_1f8.field_2._M_allocated_capacity = 0;
                  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8,
                             (size_type)phVar9);
                  bVar5 = ReadCompressedInts<unsigned_int>
                                    (this,(uint *)local_1f8._M_dataplus._M_p,
                                     (long)(local_1f8._M_string_length -
                                           (long)local_1f8._M_dataplus._M_p) >> 2);
                  if (bVar5) {
                    if (local_1f8._M_dataplus._M_p != (pointer)local_1f8._M_string_length) {
                      phVar9 = (d->
                               super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      _Var14._M_p = local_1f8._M_dataplus._M_p;
                      do {
                        phVar9->value =
                             *(uint16_t *)
                              ((long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start +
                              (ulong)*(uint *)_Var14._M_p * 2);
                        phVar9 = phVar9 + 1;
                        _Var14._M_p = _Var14._M_p + 4;
                      } while (_Var14._M_p != (pointer)local_1f8._M_string_length);
                    }
                  }
                  else {
                    ::std::__cxx11::string::append((char *)&this->_err);
                  }
                  if ((uint *)local_1f8._M_dataplus._M_p != (uint *)0x0) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity -
                                    (long)local_1f8._M_dataplus._M_p);
                  }
                  goto LAB_001b895e;
                }
              }
              else if (uVar1 == 'i') {
                local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (int *)0x0;
                local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::vector<int,_std::allocator<int>_>::resize(local_1a8,(size_type)phVar9);
                bVar5 = ReadCompressedInts<int>
                                  (this,local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                   (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 2);
                if (bVar5) {
                  phVar11 = (pointer)0x0;
                  do {
                    hVar6 = tinyusdz::value::float_to_half_full
                                      ((float)local_1a8[0].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[(long)phVar11]);
                    (d->
                    super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                    )._M_impl.super__Vector_impl_data._M_start[(long)phVar11].value = hVar6.value;
                    phVar11 = (pointer)((long)&phVar11->value + 1);
                  } while (phVar11 < phVar9);
                }
                else {
                  ::std::__cxx11::string::append((char *)&this->_err);
                }
LAB_001b895e:
                if (local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (int *)0x0) {
                  operator_delete(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start,
                                  (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                if (bVar5 == false) {
                  return false;
                }
                return true;
              }
            }
            goto LAB_001b83da;
          }
          sVar15 = uVar8 - uVar3;
          if (uVar3 + uVar4 <= uVar8) {
            sVar15 = uVar4;
          }
        }
        else {
          pSVar2 = this->_sr;
          uVar3 = pSVar2->idx_;
          sVar15 = pSVar2->length_ - uVar3;
          if (uVar3 + uVar4 <= pSVar2->length_) {
            sVar15 = uVar4;
          }
        }
        if (sVar15 - 1 < uVar4) {
          memcpy((d->
                 super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
                 _M_impl.super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,sVar15);
          pSVar2->idx_ = pSVar2->idx_ + sVar15;
          return true;
        }
LAB_001b83da:
        ::std::__cxx11::string::append((char *)&this->_err);
        return false;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadHalfArray",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1bd);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      pcVar13 = "Reached to max memory budget.";
      lVar10 = 0x1d;
      goto LAB_001b85f0;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadHalfArray",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1ba);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,"Too many array elements {}.","");
    fmt::format<unsigned_long>(&local_1f8,&local_1c8,(unsigned_long *)&local_1d0);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_001b864c;
  }
  operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
LAB_001b864c:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadHalfArray(bool is_compressed,
                                std::vector<value::half> *d) {
  size_t length;
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }

    length = size_t(n);
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Too many array elements {}.", length));
  }

  CHECK_MEMORY_USAGE(length * sizeof(uint16_t));

  d->resize(length);

  if (!is_compressed) {


    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(uint16_t) * length, sizeof(uint16_t) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      _err += "Failed to read half array data.\n";
      return false;
    }

    return true;
  } else {

    //
    // compressed data is represented by integers or look-up table.
    //

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(uint16_t) * length;
      // Not stored in compressed.
      // reader.ReadContiguous(odata, osize);
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        _err += "Failed to read uncompressed array data.\n";
        return false;
      }
      return true;
    }

    // Read the code
    char code;
    if (!_sr->read1(&code)) {
      _err += "Failed to read the code.\n";
      return false;
    }

    if (code == 'i') {
      // Compressed integers.
      std::vector<int32_t> ints;
      ints.resize(length);
      if (!ReadCompressedInts(ints.data(), ints.size())) {
        _err += "Failed to read compressed ints in ReadHalfArray.\n";
        return false;
      }
      for (size_t i = 0; i < length; i++) {
        float f = float(ints[i]);
        value::half h = value::float_to_half_full(f);
        (*d)[i] = h;
      }
    } else if (code == 't') {
      // Lookup table & indexes.
      uint32_t lutSize;
      if (!_sr->read4(&lutSize)) {
        _err += "Failed to read lutSize in ReadHalfArray.\n";
        return false;
      }

      std::vector<value::half> lut;
      lut.resize(lutSize);
      if (!_sr->read(sizeof(value::half) * lutSize, sizeof(value::half) * lutSize,
                     reinterpret_cast<uint8_t *>(lut.data()))) {
        _err += "Failed to read lut table in ReadHalfArray.\n";
        return false;
      }

      std::vector<uint32_t> indexes;
      indexes.resize(length);
      if (!ReadCompressedInts(indexes.data(), indexes.size())) {
        _err += "Failed to read lut indices in ReadHalfArray.\n";
        return false;
      }

      auto o = d->data();
      for (auto index : indexes) {
        *o++ = lut[index];
      }
    } else {
      _err += "Invalid code. Data is currupted\n";
      return false;
    }

    return true;
  }

}